

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  wasm_extern_vec_t exports;
  wasm_byte_vec_t binary;
  wasm_extern_t *imports [1];
  long local_60;
  undefined8 *local_58;
  undefined1 local_50 [8];
  void *local_48;
  undefined8 local_40 [2];
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("hello.wasm","r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar3 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_50,sVar3);
    sVar3 = fread(local_48,sVar3,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar4 = wasm_module_new(uVar2,local_50);
      if (lVar4 == 0) {
        pcVar10 = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(local_50);
        puts("Creating callback...");
        wasm_valtype_vec_new_empty(&local_60);
        wasm_valtype_vec_new_empty(local_40);
        uVar5 = wasm_functype_new(&local_60,local_40);
        uVar6 = wasm_func_new(uVar2,uVar5,hello_callback);
        wasm_functype_delete(uVar5);
        puts("Instantiating module...");
        local_40[0] = wasm_func_as_extern(uVar6);
        lVar7 = wasm_instance_new(uVar2,lVar4,local_40,0);
        if (lVar7 != 0) {
          wasm_func_delete(uVar6);
          puts("Extracting export...");
          wasm_instance_exports(lVar7,&local_60);
          iVar9 = 1;
          if (local_60 == 0) {
            pcVar10 = "> Error accessing exports!";
          }
          else {
            lVar8 = wasm_extern_as_func(*local_58);
            if (lVar8 == 0) {
              pcVar10 = "> Error accessing export!";
            }
            else {
              wasm_module_delete(lVar4);
              wasm_instance_delete(lVar7);
              puts("Calling export...");
              lVar4 = wasm_func_call(lVar8,0,0);
              if (lVar4 == 0) {
                wasm_extern_vec_delete(&local_60);
                puts("Shutting down...");
                wasm_store_delete(uVar2);
                wasm_engine_delete(uVar1);
                pcVar10 = "Done.";
                iVar9 = 0;
              }
              else {
                pcVar10 = "> Error calling function!";
              }
            }
          }
          puts(pcVar10);
          return iVar9;
        }
        pcVar10 = "> Error instantiating module!";
      }
      goto LAB_001014d7;
    }
  }
  pcVar10 = "> Error loading module!";
LAB_001014d7:
  puts(pcVar10);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("hello.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* hello_type = wasm_functype_new_0_0();
  own wasm_func_t* hello_func =
    wasm_func_new(store, hello_type, hello_callback);

  wasm_functype_delete(hello_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = { wasm_func_as_extern(hello_func) };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(hello_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  if (wasm_func_call(run_func, NULL, NULL)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}